

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVD.hpp
# Opt level: O3

void __thiscall JAMA::SVD<double>::getU(SVD<double> *this,DynamicRectMatrix<double> *A)

{
  uint ncol;
  int iVar1;
  double **ppdVar2;
  double **ppdVar3;
  double *pdVar4;
  double *pdVar5;
  long lVar6;
  ulong uVar7;
  DynamicRectMatrix<double> local_40;
  DynamicRectMatrix<double> local_30;
  
  ncol = this->m + 1;
  if (this->n < (int)ncol) {
    ncol = this->n;
  }
  OpenMD::DynamicRectMatrix<double>::DynamicRectMatrix(&local_40,this->m,ncol);
  OpenMD::DynamicRectMatrix<double>::operator=(&local_30,A);
  OpenMD::DynamicRectMatrix<double>::deallocate(&local_30);
  OpenMD::DynamicRectMatrix<double>::deallocate(&local_40);
  iVar1 = this->m;
  if (0 < (long)iVar1) {
    ppdVar2 = (this->U).data_;
    ppdVar3 = A->data_;
    lVar6 = 0;
    do {
      if (0 < (int)ncol) {
        pdVar4 = ppdVar2[lVar6];
        pdVar5 = ppdVar3[lVar6];
        uVar7 = 0;
        do {
          pdVar5[uVar7] = pdVar4[uVar7];
          uVar7 = uVar7 + 1;
        } while (ncol != uVar7);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != iVar1);
  }
  return;
}

Assistant:

void getU(DynamicRectMatrix<Real>& A) {
      int minm = min(m + 1, n);

      A = DynamicRectMatrix<Real>(m, minm);

      for (int i = 0; i < m; i++)
        for (int j = 0; j < minm; j++)
          A(i, j) = U(i, j);
    }